

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_solitaire::geometry::Area_&>::Matcher
          (Matcher<const_solitaire::geometry::Area_&> *this,Area *value)

{
  Size extraout_RDX;
  Area x;
  Area local_40;
  Matcher<const_solitaire::geometry::Area_&> local_30;
  Area *local_18;
  Area *value_local;
  Matcher<const_solitaire::geometry::Area_&> *this_local;
  
  local_18 = value;
  value_local = (Area *)this;
  internal::MatcherBase<const_solitaire::geometry::Area_&>::MatcherBase
            (&this->super_MatcherBase<const_solitaire::geometry::Area_&>);
  (this->super_MatcherBase<const_solitaire::geometry::Area_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_005048d8;
  x.size = extraout_RDX;
  x.position.x = (local_18->size).width;
  x.position.y = (local_18->size).height;
  local_40 = (Area)Eq<solitaire::geometry::Area>((testing *)local_18->position,x);
  Matcher<solitaire::geometry::Area_const&>::
  Matcher<testing::internal::EqMatcher<solitaire::geometry::Area>,void>
            ((Matcher<solitaire::geometry::Area_const&> *)&local_30,
             (EqMatcher<solitaire::geometry::Area> *)&local_40);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }